

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

triplet<unsigned_char> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
::encode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
           *this,triplet<unsigned_char> x,triplet<unsigned_char> ra,triplet<unsigned_char> rb)

{
  array<charls::context_run_mode,_2UL> *context;
  uint predicted_value;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int32_t error_value;
  int32_t error_value_00;
  int32_t error_value_01;
  uint predicted_value_00;
  uint uVar4;
  default_traits<unsigned_char,_charls::triplet<unsigned_char>_> *this_00;
  uint uVar5;
  uint uVar6;
  uint predicted_value_01;
  
  predicted_value = (uint)rb.field_2.v3;
  this_00 = &this->traits_;
  predicted_value_00 = (uint3)rb & 0xff;
  uVar6 = -(uint)(predicted_value_00 < ((uint3)ra & 0xff)) | 1;
  error_value = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::compute_error_value
                          (this_00,(((uint3)x & 0xff) - predicted_value_00) * uVar6);
  context = &this->context_run_mode_;
  encode_run_interruption_error(this,context->_M_elems,error_value);
  predicted_value_01 = rb._1_2_ & 0xff;
  uVar4 = -(uint)(predicted_value_01 < (ra._1_2_ & 0xff)) | 1;
  error_value_00 =
       default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::compute_error_value
                 (this_00,((x._1_2_ & 0xff) - predicted_value_01) * uVar4);
  encode_run_interruption_error(this,context->_M_elems,error_value_00);
  uVar5 = -(uint)(predicted_value < (uint3)ra >> 0x10) | 1;
  error_value_01 =
       default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::compute_error_value
                 (this_00,(((uint3)x >> 0x10) - predicted_value) * uVar5);
  encode_run_interruption_error(this,context->_M_elems,error_value_01);
  bVar1 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::
          compute_reconstructed_sample(this_00,predicted_value_00,uVar6 * error_value);
  bVar2 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::
          compute_reconstructed_sample(this_00,predicted_value_01,uVar4 * error_value_00);
  bVar3 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::
          compute_reconstructed_sample(this_00,predicted_value,uVar5 * error_value_01);
  return (triplet<unsigned_char>)((uint3)bVar1 | (uint3)bVar2 << 8 | (uint3)bVar3 << 0x10);
}

Assistant:

triplet<sample_type> encode_run_interruption_pixel(const triplet<sample_type> x, const triplet<sample_type> ra,
                                                       const triplet<sample_type> rb)
    {
        const int32_t error_value1{traits_.compute_error_value(sign(rb.v1 - ra.v1) * (x.v1 - rb.v1))};
        encode_run_interruption_error(context_run_mode_[0], error_value1);

        const int32_t error_value2{traits_.compute_error_value(sign(rb.v2 - ra.v2) * (x.v2 - rb.v2))};
        encode_run_interruption_error(context_run_mode_[0], error_value2);

        const int32_t error_value3{traits_.compute_error_value(sign(rb.v3 - ra.v3) * (x.v3 - rb.v3))};
        encode_run_interruption_error(context_run_mode_[0], error_value3);

        return triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                    traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                    traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3)));
    }